

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall
FxMemberFunctionCall::Resolve(FxMemberFunctionCall *this,FCompileContext *ctx)

{
  FxExpression *pFVar1;
  PStruct *funccls;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  FxExpression **ppFVar6;
  undefined4 extraout_var;
  PPointer *pPVar7;
  FxAssign *pFVar8;
  FxConstant *pFVar9;
  undefined4 extraout_var_00;
  FxVectorBuiltin *this_00;
  undefined4 extraout_var_01;
  FxGetClass *this_01;
  undefined4 extraout_var_02;
  char *pcVar10;
  Variant *pVVar11;
  PClass *this_02;
  PClass *ti;
  char *pcVar12;
  FxVMFunctionCall *this_03;
  undefined4 extraout_var_03;
  size_t sVar13;
  FxExpression *local_1f0;
  FxVMFunctionCall *x;
  FxExpression *self;
  PClass *ccls_1;
  PClass *clstype_1;
  PFunction *local_b0;
  PFunction *afd;
  bool error;
  FxGetClass *pFStack_a0;
  bool writable;
  FxGetClass *x_3;
  PType *ptype;
  FxVectorBuiltin *local_88;
  FxVectorBuiltin *x_2;
  FxAssign *local_70;
  FxExpression *x_1;
  PClass *clstype;
  FxExpression *local_58;
  FxExpression *a;
  iterator __end1;
  iterator __begin1;
  FArgumentList *__range1;
  PStruct *ccls;
  bool novirtual;
  PStruct *pPStack_28;
  bool staticonly;
  PStruct *cls;
  FCompileContext *ctx_local;
  FxMemberFunctionCall *this_local;
  
  if (ctx->Class == (PStruct *)0x0) {
    if (this != (FxMemberFunctionCall *)0x0) {
      (*(this->super_FxExpression)._vptr_FxExpression[1])();
    }
    return (FxExpression *)0x0;
  }
  bVar2 = 0;
  ccls._6_1_ = false;
  __range1 = (FArgumentList *)0x0;
  __end1 = TArray<FxExpression_*,_FxExpression_*>::begin
                     (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>);
  a = (FxExpression *)
      TArray<FxExpression_*,_FxExpression_*>::end
                (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>);
  while (bVar3 = TIterator<FxExpression_*>::operator!=(&__end1,(TIterator<FxExpression_*> *)&a),
        bVar3) {
    ppFVar6 = TIterator<FxExpression_*>::operator*(&__end1);
    local_58 = *ppFVar6;
    if (local_58 == (FxExpression *)0x0) {
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"Empty function argument.");
      if (this != (FxMemberFunctionCall *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      return (FxExpression *)0x0;
    }
    TIterator<FxExpression_*>::operator++(&__end1);
  }
  if (this->Self->ExprType == EFX_Identifier) {
    FName::FName((FName *)((long)&clstype + 4),(FName *)(this->Self + 1));
    __range1 = (FArgumentList *)FindStructType((FName *)((long)&clstype + 4));
    if ((PStruct *)__range1 != (PStruct *)0x0) {
      *(undefined1 *)((long)&this->Self[1]._vptr_FxExpression + 4) = 1;
    }
  }
  if (this->Self != (FxExpression *)0x0) {
    iVar4 = (*this->Self->_vptr_FxExpression[2])(this->Self,ctx);
    this->Self = (FxExpression *)CONCAT44(extraout_var,iVar4);
  }
  if (this->Self == (FxExpression *)0x0) {
    if (this != (FxMemberFunctionCall *)0x0) {
      (*(this->super_FxExpression)._vptr_FxExpression[1])();
    }
    return (FxExpression *)0x0;
  }
  if (((this->Self->ValueType != &TypeError->super_PType) || (__range1 == (FArgumentList *)0x0)) ||
     ((bVar3 = DObject::IsKindOf((DObject *)__range1,PClass::RegistrationInfo.MyClass), bVar3 &&
      (((ulong)__range1[0xf].super_TArray<FxExpression_*,_FxExpression_*>.Array & 0x100) == 0)))) {
    if (this->Self->ExprType == EFX_Super) {
      pVVar11 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                          (&ctx->Function->Variants,0);
      x_1 = (FxExpression *)dyn_cast<PClass>((DObject *)pVVar11->SelfClass);
      bVar3 = (PClass *)x_1 == (PClass *)0x0;
      if (bVar3) {
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Super requires a class type");
      }
      else {
        pPVar7 = NewPointer((PType *)((PClass *)x_1)->ParentClass,false);
        this->Self->ValueType = (PType *)pPVar7;
        this->Self->ExprType = EFX_Self;
      }
      ccls._6_1_ = !bVar3;
    }
    if (this->Self->ValueType == (PType *)TypeTextureID) {
      sVar13 = 0x27f;
      bVar3 = FName::operator==(&this->MethodName,NAME_IsValid);
      if (bVar3) {
LAB_00774852:
        uVar5 = TArray<FxExpression_*,_FxExpression_*>::Size
                          (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>);
        if (uVar5 != 0) {
          pcVar10 = FName::GetChars(&this->MethodName);
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,
                     "too many parameters in call to %s",pcVar10);
          if (this != (FxMemberFunctionCall *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          return (FxExpression *)0x0;
        }
        this->Self->ValueType = (PType *)TypeSInt32;
        iVar4 = FName::operator_cast_to_int(&this->MethodName);
        switch(iVar4) {
        case 0x27f:
          pFVar8 = (FxAssign *)FxExpression::operator_new((FxExpression *)0x48,sVar13);
          pFVar1 = this->Self;
          pFVar9 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,sVar13);
          FxConstant::FxConstant(pFVar9,0,&(this->super_FxExpression).ScriptPosition);
          FxCompareRel::FxCompareRel((FxCompareRel *)pFVar8,0x3e,pFVar1,(FxExpression *)pFVar9);
          local_70 = pFVar8;
          break;
        case 0x280:
          pFVar8 = (FxAssign *)FxExpression::operator_new((FxExpression *)0x40,sVar13);
          pFVar1 = this->Self;
          pFVar9 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,sVar13);
          FxConstant::FxConstant(pFVar9,0,&(this->super_FxExpression).ScriptPosition);
          FxCompareEq::FxCompareEq((FxCompareEq *)pFVar8,0x11f,pFVar1,(FxExpression *)pFVar9);
          local_70 = pFVar8;
          break;
        case 0x281:
          pFVar8 = (FxAssign *)FxExpression::operator_new((FxExpression *)0x48,sVar13);
          pFVar1 = this->Self;
          pFVar9 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,sVar13);
          FxConstant::FxConstant(pFVar9,0,&(this->super_FxExpression).ScriptPosition);
          FxCompareRel::FxCompareRel((FxCompareRel *)pFVar8,0x11e,pFVar1,(FxExpression *)pFVar9);
          local_70 = pFVar8;
          break;
        case 0x282:
          pFVar8 = (FxAssign *)FxExpression::operator_new((FxExpression *)0x48,sVar13);
          pFVar1 = this->Self;
          pFVar9 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,sVar13);
          FxConstant::FxConstant(pFVar9,-1,&(this->super_FxExpression).ScriptPosition);
          FxAssign::FxAssign(pFVar8,pFVar1,(FxExpression *)pFVar9,false);
          local_70 = pFVar8;
          break;
        case 0x283:
          pFVar8 = (FxAssign *)FxExpression::operator_new((FxExpression *)0x48,sVar13);
          pFVar1 = this->Self;
          pFVar9 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,sVar13);
          FxConstant::FxConstant(pFVar9,0,&(this->super_FxExpression).ScriptPosition);
          FxAssign::FxAssign(pFVar8,pFVar1,(FxExpression *)pFVar9,false);
          local_70 = pFVar8;
        }
        this->Self = (FxExpression *)0x0;
        if (local_70 != (FxAssign *)0x0) {
          iVar4 = (*(((FxBinary *)&local_70->super_FxExpression)->super_FxExpression).
                    _vptr_FxExpression[2])(local_70,ctx);
          local_70 = (FxAssign *)CONCAT44(extraout_var_00,iVar4);
        }
        if (local_70 != (FxAssign *)0x0) {
          bVar3 = FName::operator==(&this->MethodName,NAME_SetInvalid);
          if ((bVar3) || (bVar3 = FName::operator==(&this->MethodName,NAME_SetNull), bVar3)) {
            (((FxBinary *)&local_70->super_FxExpression)->super_FxExpression).ValueType =
                 &TypeVoid->super_PType;
          }
          if (this != (FxMemberFunctionCall *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          return &local_70->super_FxExpression;
        }
        if (this != (FxMemberFunctionCall *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        return (FxExpression *)0x0;
      }
      sVar13 = 0x280;
      bVar3 = FName::operator==(&this->MethodName,NAME_IsNull);
      if (bVar3) goto LAB_00774852;
      sVar13 = 0x281;
      bVar3 = FName::operator==(&this->MethodName,NAME_Exists);
      if (bVar3) goto LAB_00774852;
      sVar13 = 0x282;
      bVar3 = FName::operator==(&this->MethodName,NAME_SetInvalid);
      if (bVar3) goto LAB_00774852;
      sVar13 = 0x283;
      bVar3 = FName::operator==(&this->MethodName,NAME_SetNull);
      if (bVar3) goto LAB_00774852;
    }
    bVar3 = FxExpression::IsVector(this->Self);
    if (bVar3) {
      sVar13 = 0x279;
      bVar3 = FName::operator==(&this->MethodName,NAME_Length);
      if (bVar3) {
LAB_00774dd4:
        uVar5 = TArray<FxExpression_*,_FxExpression_*>::Size
                          (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>);
        if (uVar5 != 0) {
          pcVar10 = FName::GetChars(&this->MethodName);
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,
                     "too many parameters in call to %s",pcVar10);
          if (this != (FxMemberFunctionCall *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          return (FxExpression *)0x0;
        }
        this_00 = (FxVectorBuiltin *)FxExpression::operator_new((FxExpression *)0x38,sVar13);
        pFVar1 = this->Self;
        FName::FName((FName *)((long)&ptype + 4),&this->MethodName);
        FxVectorBuiltin::FxVectorBuiltin(this_00,pFVar1,(FName *)((long)&ptype + 4));
        this->Self = (FxExpression *)0x0;
        local_88 = this_00;
        if (this != (FxMemberFunctionCall *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        iVar4 = (*(local_88->super_FxExpression)._vptr_FxExpression[2])(local_88,ctx);
        return (FxExpression *)CONCAT44(extraout_var_01,iVar4);
      }
      sVar13 = 0x27a;
      bVar3 = FName::operator==(&this->MethodName,NAME_Unit);
      if (bVar3) goto LAB_00774dd4;
    }
    if (this->Self->ValueType == (PType *)TypeString) {
      this->Self->ValueType = (PType *)TypeStringStruct;
    }
    bVar3 = DObject::IsKindOf((DObject *)this->Self->ValueType,PPointer::RegistrationInfo.MyClass);
    if (bVar3) {
      x_3 = (FxGetClass *)this->Self->ValueType[1].super_PTypeBase.super_DObject._vptr_DObject;
      bVar3 = DObject::IsKindOf((DObject *)x_3,PStruct::RegistrationInfo.MyClass);
      if (!bVar3) {
        pcVar10 = FName::GetChars(&this->MethodName);
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,
                   "Left hand side of %s must point to a class object\n",pcVar10);
        if (this != (FxMemberFunctionCall *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        return (FxExpression *)0x0;
      }
      bVar3 = DObject::IsKindOf((DObject *)x_3,PClass::RegistrationInfo.MyClass);
      if (bVar3) {
        sVar13 = 0xd6;
        bVar3 = FName::operator==(&this->MethodName,NAME_GetClass);
        if (bVar3) {
          uVar5 = TArray<FxExpression_*,_FxExpression_*>::Size
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>);
          if (uVar5 != 0) {
            pcVar10 = FName::GetChars(&this->MethodName);
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,2,
                       "too many parameters in call to %s",pcVar10);
            if (this != (FxMemberFunctionCall *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            return (FxExpression *)0x0;
          }
          this_01 = (FxGetClass *)FxExpression::operator_new((FxExpression *)0x30,sVar13);
          FxGetClass::FxGetClass(this_01,this->Self);
          pFStack_a0 = this_01;
          iVar4 = (*(this_01->super_FxExpression)._vptr_FxExpression[2])(this_01,ctx);
          return (FxExpression *)CONCAT44(extraout_var_02,iVar4);
        }
      }
      pPStack_28 = (PStruct *)x_3;
    }
    else {
      bVar3 = DObject::IsKindOf((DObject *)this->Self->ValueType,PStruct::RegistrationInfo.MyClass);
      if (!bVar3) {
        pcVar10 = FName::GetChars(&this->MethodName);
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,
                   "Invalid expression on left hand side of %s\n",pcVar10);
        if (this != (FxMemberFunctionCall *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        return (FxExpression *)0x0;
      }
      uVar5 = (*this->Self->_vptr_FxExpression[4])(this->Self,ctx,(long)&afd + 7);
      if (((uVar5 & 1) == 0) || ((afd._7_1_ & 1) == 0)) {
        pcVar10 = FName::GetChars(&this->MethodName);
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,
                   "Invalid expression on left hand side of %s\n",pcVar10);
        if (this != (FxMemberFunctionCall *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        return (FxExpression *)0x0;
      }
      pPStack_28 = (PStruct *)this->Self->ValueType;
      pPVar7 = NewPointer(this->Self->ValueType,false);
      this->Self->ValueType = (PType *)pPVar7;
    }
  }
  else {
    pPStack_28 = (PStruct *)__range1;
    bVar2 = 1;
  }
  afd._6_1_ = 0;
  funccls = ctx->Class;
  FName::FName((FName *)((long)&clstype_1 + 4),&this->MethodName);
  local_b0 = FindClassMemberFunction
                       (pPStack_28,funccls,(FName *)((long)&clstype_1 + 4),
                        &(this->super_FxExpression).ScriptPosition,(bool *)((long)&afd + 6));
  if ((afd._6_1_ & 1) == 0) {
    if (local_b0 == (PFunction *)0x0) {
      pcVar10 = FName::GetChars(&this->MethodName);
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"Unknown function %s\n",pcVar10);
      if (this != (FxMemberFunctionCall *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxMemberFunctionCall *)0x0;
    }
    else if ((bVar2 == 0) ||
            (pVVar11 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                                 (&local_b0->Variants,0), (pVVar11->Flags & 2) == 0)) {
      pVVar11 = TArray<PFunction::Variant,_PFunction::Variant>::operator[](&local_b0->Variants,0);
      if ((pVVar11->Flags & 2) != 0) {
        if (this->Self->ExprType == EFX_Self) {
          bVar3 = CheckFunctionCompatiblity
                            (&(this->super_FxExpression).ScriptPosition,ctx->Function,local_b0);
          if (!bVar3) {
            if (this != (FxMemberFunctionCall *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            return (FxExpression *)0x0;
          }
        }
        else {
          pVVar11 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                              (&local_b0->Variants,0);
          if ((pVVar11->UseFlags & 1U) == 0) {
            pcVar10 = FName::GetChars((FName *)&(local_b0->super_PSymbol).super_PTypeBase.
                                                super_DObject.field_0x24);
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,2,
                       "Function %s cannot be used with a non-self object\n",pcVar10);
            if (this != (FxMemberFunctionCall *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            return (FxExpression *)0x0;
          }
        }
      }
      sVar13 = 0;
      pVVar11 = TArray<PFunction::Variant,_PFunction::Variant>::operator[](&local_b0->Variants,0);
      if ((pVVar11->Flags & 2) == 0) {
        local_1f0 = (FxExpression *)0x0;
      }
      else {
        local_1f0 = this->Self;
      }
      this_03 = (FxVMFunctionCall *)FxExpression::operator_new((FxExpression *)0x68,sVar13);
      FxVMFunctionCall::FxVMFunctionCall
                (this_03,local_1f0,local_b0,&this->ArgList,
                 &(this->super_FxExpression).ScriptPosition,(bool)(bVar2 | ccls._6_1_));
      if (this->Self == local_1f0) {
        this->Self = (FxExpression *)0x0;
      }
      if (this != (FxMemberFunctionCall *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      iVar4 = (*(this_03->super_FxExpression)._vptr_FxExpression[2])(this_03,ctx);
      this_local = (FxMemberFunctionCall *)CONCAT44(extraout_var_03,iVar4);
    }
    else {
      this_02 = dyn_cast<PClass>((DObject *)ctx->Class);
      ti = dyn_cast<PClass>((DObject *)pPStack_28);
      if (((this_02 == (PClass *)0x0) || (ti == (PClass *)0x0)) ||
         (bVar3 = PClass::IsDescendantOf(this_02,ti), !bVar3)) {
        pcVar10 = FName::GetChars(&(pPStack_28->super_PNamedType).TypeName);
        pcVar12 = FName::GetChars(&this->MethodName);
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,
                   "Cannot call non-static function %s::%s from here\n",pcVar10,pcVar12);
        if (this != (FxMemberFunctionCall *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        this_local = (FxMemberFunctionCall *)0x0;
      }
      else {
        pcVar10 = FName::GetChars(&(pPStack_28->super_PNamedType).TypeName);
        pcVar12 = FName::GetChars(&this->MethodName);
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,
                   "Qualified member call to parent class %s::%s is not yet implemented\n",pcVar10,
                   pcVar12);
        if (this != (FxMemberFunctionCall *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        this_local = (FxMemberFunctionCall *)0x0;
      }
    }
  }
  else {
    if (this != (FxMemberFunctionCall *)0x0) {
      (*(this->super_FxExpression)._vptr_FxExpression[1])();
    }
    this_local = (FxMemberFunctionCall *)0x0;
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxMemberFunctionCall::Resolve(FCompileContext& ctx)
{
	ABORT(ctx.Class);
	PStruct *cls;
	bool staticonly = false;
	bool novirtual = false;

	PStruct *ccls = nullptr;

	for (auto a : ArgList)
	{
		if (a == nullptr)
		{
			ScriptPosition.Message(MSG_ERROR, "Empty function argument.");
			delete this;
			return nullptr;
		}
	}

	if (Self->ExprType == EFX_Identifier)
	{
		// If the left side is a class name for a static member function call it needs to be resolved manually 
		// because the resulting value type would cause problems in nearly every other place where identifiers are being used.
		ccls = FindStructType(static_cast<FxIdentifier *>(Self)->Identifier);
		if (ccls != nullptr) static_cast<FxIdentifier *>(Self)->noglobal = true;
	}

	SAFE_RESOLVE(Self, ctx);

	if (Self->ValueType == TypeError)
	{
		if (ccls != nullptr)
		{
			if (!ccls->IsKindOf(RUNTIME_CLASS(PClass)) || static_cast<PClass *>(ccls)->bExported)
			{
				cls = ccls;
				staticonly = true;
				goto isresolved;
			}
		}
	}

	if (Self->ExprType == EFX_Super)
	{
		auto clstype = dyn_cast<PClass>(ctx.Function->Variants[0].SelfClass);
		if (clstype != nullptr)
		{
			// give the node the proper value type now that we know it's properly used.
			cls = clstype->ParentClass;
			Self->ValueType = NewPointer(cls);
			Self->ExprType = EFX_Self;
			novirtual = true;	// super calls are always non-virtual
		}
		else
		{
			ScriptPosition.Message(MSG_ERROR, "Super requires a class type");
		}
	}

	// Note: These builtins would better be relegated to the actual type objects, instead of polluting this file, but that's a task for later.

	// Texture builtins.
	if (Self->ValueType == TypeTextureID)
	{
		if (MethodName == NAME_IsValid || MethodName == NAME_IsNull || MethodName == NAME_Exists || MethodName == NAME_SetInvalid || MethodName == NAME_SetNull)
		{
			if (ArgList.Size() > 0)
			{
				ScriptPosition.Message(MSG_ERROR, "too many parameters in call to %s", MethodName.GetChars());
				delete this;
				return nullptr;
			}
			// No need to create a dedicated node here, all builtins map directly to trivial operations.
			Self->ValueType = TypeSInt32;	// all builtins treat the texture index as integer.
			FxExpression *x;
			switch (MethodName)
			{
			case NAME_IsValid:
				x = new FxCompareRel('>', Self, new FxConstant(0, ScriptPosition));
				break;

			case NAME_IsNull:
				x = new FxCompareEq(TK_Eq, Self, new FxConstant(0, ScriptPosition));
				break;

			case NAME_Exists:
				x = new FxCompareRel(TK_Geq, Self, new FxConstant(0, ScriptPosition));
				break;

			case NAME_SetInvalid:
				x = new FxAssign(Self, new FxConstant(-1, ScriptPosition));
				break;

			case NAME_SetNull:
				x = new FxAssign(Self, new FxConstant(0, ScriptPosition));
				break;
			}
			Self = nullptr;
			SAFE_RESOLVE(x, ctx);
			if (MethodName == NAME_SetInvalid || MethodName == NAME_SetNull) x->ValueType = TypeVoid; // override the default type of the assignment operator.
			delete this;
			return x;
		}
	}

	if (Self->IsVector())
	{
		// handle builtins: Vectors got 2: Length and Unit.
		if (MethodName == NAME_Length || MethodName == NAME_Unit)
		{
			if (ArgList.Size() > 0)
			{
				ScriptPosition.Message(MSG_ERROR, "too many parameters in call to %s", MethodName.GetChars());
				delete this;
				return nullptr;
			}
			auto x = new FxVectorBuiltin(Self, MethodName);
			Self = nullptr;
			delete this;
			return x->Resolve(ctx);
		}
	}

	if (Self->ValueType == TypeString)
	{
		// same for String methods. It also uses a hidden struct type to define them.
		Self->ValueType = TypeStringStruct;
	}

	if (Self->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)))
	{
		auto ptype = static_cast<PPointer *>(Self->ValueType)->PointedType;
		if (ptype->IsKindOf(RUNTIME_CLASS(PStruct)))
		{
			if (ptype->IsKindOf(RUNTIME_CLASS(PClass)) && MethodName == NAME_GetClass)
			{
				if (ArgList.Size() > 0)
				{
					ScriptPosition.Message(MSG_ERROR, "too many parameters in call to %s", MethodName.GetChars());
					delete this;
					return nullptr;
				}
				auto x = new FxGetClass(Self);
				return x->Resolve(ctx);
			}
			cls = static_cast<PStruct *>(ptype);
		}
		else
		{
			ScriptPosition.Message(MSG_ERROR, "Left hand side of %s must point to a class object\n", MethodName.GetChars());
			delete this;
			return nullptr;
		}
	}
	else if (Self->ValueType->IsKindOf(RUNTIME_CLASS(PStruct)))
	{
		bool writable;
		if (Self->RequestAddress(ctx, &writable) && writable)
		{
			cls = static_cast<PStruct*>(Self->ValueType);
			Self->ValueType = NewPointer(Self->ValueType);
		}
		else
		{
			// Cannot be made writable so we cannot use its methods.
			ScriptPosition.Message(MSG_ERROR, "Invalid expression on left hand side of %s\n", MethodName.GetChars());
			delete this;
			return nullptr;
		}
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Invalid expression on left hand side of %s\n", MethodName.GetChars());
		delete this;
		return nullptr;
	}

	// Todo: handle member calls from instantiated structs.

isresolved:
	bool error = false;
	PFunction *afd = FindClassMemberFunction(cls, ctx.Class, MethodName, ScriptPosition, &error);
	if (error)
	{
		delete this;
		return nullptr;
	}

	if (afd == nullptr)
	{
		ScriptPosition.Message(MSG_ERROR, "Unknown function %s\n", MethodName.GetChars());
		delete this;
		return nullptr;
	}

	if (staticonly && (afd->Variants[0].Flags & VARF_Method))
	{
		auto clstype = dyn_cast<PClass>(ctx.Class);
		auto ccls = dyn_cast<PClass>(cls);
		if (clstype == nullptr || ccls == nullptr || !clstype->IsDescendantOf(ccls))
		{
			ScriptPosition.Message(MSG_ERROR, "Cannot call non-static function %s::%s from here\n", cls->TypeName.GetChars(), MethodName.GetChars());
			delete this;
			return nullptr;
		}
		else
		{
			// Todo: If this is a qualified call to a parent class function, let it through (but this needs to disable virtual calls later.)
			ScriptPosition.Message(MSG_ERROR, "Qualified member call to parent class %s::%s is not yet implemented\n", cls->TypeName.GetChars(), MethodName.GetChars());
			delete this;
			return nullptr;
		}
	}

	if (afd->Variants[0].Flags & VARF_Method)
	{
		if (Self->ExprType == EFX_Self)
		{
			if (!CheckFunctionCompatiblity(ScriptPosition, ctx.Function, afd))
			{
				delete this;
				return nullptr;
			}
		}
		else
		{
			// Functions with no Actor usage may not be called through a pointer because they will lose their context.
			if (!(afd->Variants[0].UseFlags & SUF_ACTOR))
			{
				ScriptPosition.Message(MSG_ERROR, "Function %s cannot be used with a non-self object\n", afd->SymbolName.GetChars());
				delete this;
				return nullptr;
			}
		}
	}

	// do not pass the self pointer to static functions.
	auto self = (afd->Variants[0].Flags & VARF_Method) ? Self : nullptr;
	auto x = new FxVMFunctionCall(self, afd, ArgList, ScriptPosition, staticonly|novirtual);
	if (Self == self) Self = nullptr;
	delete this;
	return x->Resolve(ctx);
}